

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O1

void __thiscall Assimp::BVHLoader::CreateAnimation(BVHLoader *this,aiScene *pScene)

{
  undefined8 *puVar1;
  char *__s;
  _Rb_tree_header *p_Var2;
  aiNode *paVar3;
  size_type sVar4;
  aiAnimation **ppaVar5;
  aiAnimation *paVar6;
  aiNodeAnim **ppaVar7;
  size_t sVar8;
  aiNodeAnim *paVar9;
  pointer pCVar10;
  mapped_type *pmVar11;
  aiVectorKey *paVar12;
  aiQuatKey *paVar13;
  _Base_ptr p_Var14;
  runtime_error *prVar15;
  long lVar16;
  ulong uVar17;
  aiQuatKey *paVar18;
  _Base_ptr p_Var19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  pointer pNVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  string nodeName;
  map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
  channelMap;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  aiAnimation *local_90;
  ulong local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<Assimp::BVHLoader::ChannelType,_std::pair<const_Assimp::BVHLoader::ChannelType,_int>,_std::_Select1st<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
  local_60;
  
  pScene->mNumAnimations = 1;
  ppaVar5 = (aiAnimation **)operator_new__(8);
  pScene->mAnimations = ppaVar5;
  paVar6 = (aiAnimation *)operator_new(0x448);
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mDuration = -1.0;
  paVar6->mTicksPerSecond = 0.0;
  paVar6->mNumChannels = 0;
  paVar6->mChannels = (aiNodeAnim **)0x0;
  paVar6->mNumMeshChannels = 0;
  paVar6->mMeshChannels = (aiMeshAnim **)0x0;
  paVar6->mNumMorphMeshChannels = 0;
  paVar6->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  *ppaVar5 = paVar6;
  (paVar6->mName).length = 6;
  builtin_strncpy((paVar6->mName).data,"Motion",7);
  paVar6->mTicksPerSecond = 1.0 / (double)this->mAnimTickDuration;
  paVar6->mDuration = (double)(this->mAnimNumFrames - 1);
  uVar21 = ((long)(this->mNodes).
                  super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mNodes).
                  super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  uVar20 = (uint)uVar21;
  paVar6->mNumChannels = uVar20;
  ppaVar7 = (aiNodeAnim **)operator_new__((uVar21 & 0xffffffff) << 3);
  paVar6->mChannels = ppaVar7;
  if (uVar20 != 0) {
    uVar21 = 0;
    do {
      paVar6->mChannels[uVar21] = (aiNodeAnim *)0x0;
      uVar21 = uVar21 + 1;
    } while (uVar21 < paVar6->mNumChannels);
  }
  if (paVar6->mNumChannels != 0) {
    p_Var2 = &local_60._M_impl.super__Rb_tree_header;
    uVar21 = 0;
    local_90 = paVar6;
    do {
      paVar6 = local_90;
      pNVar23 = (this->mNodes).
                super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar3 = pNVar23[uVar21].mNode;
      __s = (paVar3->mName).data;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      sVar8 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,__s,(long)(paVar3->mName).data + sVar8);
      paVar9 = (aiNodeAnim *)operator_new(0x438);
      (paVar9->mNodeName).length = 0;
      (paVar9->mNodeName).data[0] = '\0';
      memset((paVar9->mNodeName).data + 1,0x1b,0x3ff);
      sVar4 = local_b0._M_string_length;
      paVar9->mRotationKeys = (aiQuatKey *)0x0;
      paVar9->mNumScalingKeys = 0;
      *(undefined8 *)&paVar9->mNumPositionKeys = 0;
      *(undefined8 *)((long)&paVar9->mPositionKeys + 4) = 0;
      paVar9->mScalingKeys = (aiVectorKey *)0x0;
      paVar9->mPreState = aiAnimBehaviour_DEFAULT;
      paVar9->mPostState = aiAnimBehaviour_DEFAULT;
      paVar6->mChannels[uVar21] = paVar9;
      local_88 = uVar21;
      if (local_b0._M_string_length < 0x400) {
        (paVar9->mNodeName).length = (ai_uint32)local_b0._M_string_length;
        memcpy((paVar9->mNodeName).data,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        (paVar9->mNodeName).data[sVar4] = '\0';
      }
      pNVar23 = pNVar23 + uVar21;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      uVar21 = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      pCVar10 = (pNVar23->mChannels).
                super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      if (*(pointer *)
           ((long)&(pNVar23->mChannels).
                   super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                   ._M_impl + 8) != pCVar10) {
        do {
          pmVar11 = std::
                    map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                    ::operator[]((map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                                  *)&local_60,pCVar10 + uVar21);
          *pmVar11 = (int)uVar21;
          uVar21 = (ulong)((int)uVar21 + 1);
          pCVar10 = (pNVar23->mChannels).
                    super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar16 = (long)*(pointer *)
                          ((long)&(pNVar23->mChannels).
                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                  ._M_impl + 8) - (long)pCVar10;
        } while (uVar21 < (ulong)(lVar16 >> 2));
        uVar21 = (ulong)(lVar16 == 0x18);
      }
      if ((char)uVar21 == '\0') {
        paVar3 = pNVar23->mNode;
        fVar27 = (paVar3->mTransformation).a4;
        fVar33 = (paVar3->mTransformation).b4;
        fVar36 = (paVar3->mTransformation).c4;
        paVar9->mNumPositionKeys = 1;
        paVar12 = (aiVectorKey *)operator_new__(0x18);
        paVar12->mTime = 0.0;
        (paVar12->mValue).x = 0.0;
        (paVar12->mValue).y = 0.0;
        (paVar12->mValue).z = 0.0;
        paVar9->mPositionKeys = paVar12;
        paVar12->mTime = 0.0;
        (paVar12->mValue).x = fVar27;
        (paVar12->mValue).y = fVar33;
        (paVar12->mValue).z = fVar36;
      }
      else {
        uVar21 = (ulong)this->mAnimNumFrames;
        paVar9->mNumPositionKeys = this->mAnimNumFrames;
        paVar12 = (aiVectorKey *)operator_new__(uVar21 * 0x18);
        if (uVar21 != 0) {
          uVar17 = 0;
          do {
            puVar1 = (undefined8 *)((long)&paVar12->mTime + uVar17);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined4 *)((long)&(paVar12->mValue).z + uVar17) = 0;
            uVar17 = uVar17 + 0x18;
          } while (uVar21 * 0x18 != uVar17);
        }
        paVar9->mPositionKeys = paVar12;
        if (uVar21 != 0) {
          uVar17 = 0;
          do {
            paVar12->mTime = (double)(uVar17 & 0xffffffff);
            iVar22 = 0;
            p_Var14 = &p_Var2->_M_header;
            p_Var19 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              for (; (_Rb_tree_header *)p_Var19 != (_Rb_tree_header *)0x0;
                  p_Var19 = (&p_Var19->_M_left)[(int)*(size_t *)(p_Var19 + 1) < iVar22]) {
                if (iVar22 <= (int)*(size_t *)(p_Var19 + 1)) {
                  p_Var14 = p_Var19;
                }
              }
              p_Var19 = &p_Var2->_M_header;
              if (((_Rb_tree_header *)p_Var14 != p_Var2) &&
                 (p_Var19 = p_Var14, iVar22 < (int)p_Var14[1]._M_color)) {
                p_Var19 = &p_Var2->_M_header;
              }
              if ((_Rb_tree_header *)p_Var19 == p_Var2) {
                prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_80,"Missing position channel in node ",&local_b0);
                std::runtime_error::runtime_error(prVar15,(string *)&local_80);
                *(undefined ***)prVar15 = &PTR__runtime_error_007fd498;
                __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              lVar16 = (long)*(int *)&p_Var19[1].field_0x4;
              if (iVar22 == 2) {
                (paVar12->mValue).z =
                     *(float *)(((ulong)((long)*(pointer *)
                                                ((long)&(pNVar23->mChannels).
                                                                                                                
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl + 8) -
                                        *(long *)&(pNVar23->mChannels).
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl.super__Vector_impl_data) >> 2) * uVar17 *
                                4 + *(long *)&(pNVar23->mChannelValues).
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data + lVar16 * 4);
              }
              else if (iVar22 == 1) {
                (paVar12->mValue).y =
                     *(float *)(((ulong)((long)*(pointer *)
                                                ((long)&(pNVar23->mChannels).
                                                                                                                
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl + 8) -
                                        *(long *)&(pNVar23->mChannels).
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl.super__Vector_impl_data) >> 2) * uVar17 *
                                4 + *(long *)&(pNVar23->mChannelValues).
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data + lVar16 * 4);
              }
              else if (iVar22 == 0) {
                (paVar12->mValue).x =
                     *(float *)(((ulong)((long)*(pointer *)
                                                ((long)&(pNVar23->mChannels).
                                                                                                                
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl + 8) -
                                        *(long *)&(pNVar23->mChannels).
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl.super__Vector_impl_data) >> 2) * uVar17 *
                                4 + *(long *)&(pNVar23->mChannelValues).
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data + lVar16 * 4);
              }
              iVar22 = iVar22 + 1;
              p_Var14 = &p_Var2->_M_header;
              p_Var19 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            } while (iVar22 != 3);
            paVar12 = paVar12 + 1;
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar21);
        }
      }
      uVar21 = (ulong)this->mAnimNumFrames;
      paVar9->mNumRotationKeys = this->mAnimNumFrames;
      paVar13 = (aiQuatKey *)operator_new__(uVar21 * 0x18);
      if (uVar21 != 0) {
        paVar18 = paVar13;
        do {
          paVar18->mTime = 0.0;
          (paVar18->mValue).w = 1.0;
          (paVar18->mValue).x = 0.0;
          (paVar18->mValue).y = 0.0;
          (paVar18->mValue).z = 0.0;
          paVar18 = paVar18 + 1;
        } while (paVar18 != paVar13 + uVar21);
      }
      paVar9->mRotationKeys = paVar13;
      if (this->mAnimNumFrames != 0) {
        uVar21 = 0;
        do {
          iVar22 = 3;
          fVar39 = 1.0;
          fVar37 = 0.0;
          fVar35 = 0.0;
          p_Var14 = &p_Var2->_M_header;
          p_Var19 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          fVar27 = 1.0;
          fVar33 = 0.0;
          fVar36 = 0.0;
          fVar38 = 0.0;
          fVar32 = 0.0;
          fVar28 = 1.0;
          do {
            for (; p_Var19 != (_Base_ptr)0x0;
                p_Var19 = (&p_Var19->_M_left)[(int)p_Var19[1]._M_color < iVar22]) {
              if (iVar22 <= (int)p_Var19[1]._M_color) {
                p_Var14 = p_Var19;
              }
            }
            p_Var19 = &p_Var2->_M_header;
            if (((_Rb_tree_header *)p_Var14 != p_Var2) &&
               (p_Var19 = p_Var14, iVar22 < (int)p_Var14[1]._M_color)) {
              p_Var19 = &p_Var2->_M_header;
            }
            if ((_Rb_tree_header *)p_Var19 == p_Var2) {
              prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_80,"Missing rotation channel in node ",&local_b0);
              std::runtime_error::runtime_error(prVar15,(string *)&local_80);
              *(undefined ***)prVar15 = &PTR__runtime_error_007fd498;
              __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            fVar24 = (*(float *)(((ulong)((long)*(pointer *)
                                                 ((long)&(pNVar23->mChannels).
                                                                                                                  
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl + 8) -
                                         *(long *)&(pNVar23->mChannels).
                                                                                                      
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl.super__Vector_impl_data) >> 2) * uVar21 *
                                 4 + *(long *)&(pNVar23->mChannelValues).
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data +
                                (long)*(int *)&p_Var19[1].field_0x4 * 4) * 3.1415927) / 180.0;
            if (iVar22 == 5) {
              fVar26 = cosf(fVar24);
              fVar24 = sinf(fVar24);
              fVar40 = fVar26 * fVar27 + fVar33 * fVar24 + fVar35 * 0.0;
              fVar29 = (fVar33 * fVar26 - fVar24 * fVar27) + fVar35 * 0.0;
              fVar35 = fVar35 + fVar27 * 0.0 + fVar33 * 0.0;
              fVar30 = fVar26 * fVar36 + fVar28 * fVar24 + fVar37 * 0.0;
              fVar31 = (fVar28 * fVar26 - fVar24 * fVar36) + fVar37 * 0.0;
              fVar37 = fVar37 + fVar36 * 0.0 + fVar28 * 0.0;
              fVar34 = fVar26 * fVar38 + fVar32 * fVar24 + fVar39 * 0.0;
              fVar26 = (fVar32 * fVar26 - fVar24 * fVar38) + fVar39 * 0.0;
              fVar39 = fVar39 + fVar38 * 0.0 + fVar32 * 0.0;
            }
            else if (iVar22 == 4) {
              fVar25 = cosf(fVar24);
              fVar24 = sinf(fVar24);
              fVar40 = (fVar25 * fVar27 + fVar33 * 0.0) - fVar24 * fVar35;
              fVar29 = fVar35 * 0.0 + fVar27 * 0.0 + fVar33;
              fVar35 = fVar24 * fVar27 + fVar33 * 0.0 + fVar25 * fVar35;
              fVar30 = (fVar25 * fVar36 + fVar28 * 0.0) - fVar24 * fVar37;
              fVar31 = fVar37 * 0.0 + fVar36 * 0.0 + fVar28;
              fVar37 = fVar24 * fVar36 + fVar28 * 0.0 + fVar25 * fVar37;
              fVar34 = (fVar25 * fVar38 + fVar32 * 0.0) - fVar24 * fVar39;
              fVar26 = fVar39 * 0.0 + fVar38 * 0.0 + fVar32;
              fVar39 = fVar24 * fVar38 + fVar32 * 0.0 + fVar25 * fVar39;
            }
            else {
              fVar26 = fVar32;
              fVar34 = fVar38;
              fVar30 = fVar36;
              fVar29 = fVar33;
              fVar40 = fVar27;
              fVar31 = fVar28;
              if (iVar22 == 3) {
                fVar25 = cosf(fVar24);
                fVar24 = sinf(fVar24);
                fVar40 = fVar35 * 0.0 + fVar33 * 0.0 + fVar27;
                fVar29 = fVar24 * fVar35 + fVar33 * fVar25 + fVar27 * 0.0;
                fVar35 = fVar35 * fVar25 + (fVar27 * 0.0 - fVar33 * fVar24);
                fVar30 = fVar37 * 0.0 + fVar28 * 0.0 + fVar36;
                fVar31 = fVar24 * fVar37 + fVar28 * fVar25 + fVar36 * 0.0;
                fVar37 = fVar37 * fVar25 + (fVar36 * 0.0 - fVar28 * fVar24);
                fVar34 = fVar39 * 0.0 + fVar32 * 0.0 + fVar38;
                fVar26 = fVar24 * fVar39 + fVar32 * fVar25 + fVar38 * 0.0;
                fVar39 = fVar25 * fVar39 + (fVar38 * 0.0 - fVar32 * fVar24);
              }
            }
            iVar22 = iVar22 + 1;
            p_Var14 = &p_Var2->_M_header;
            p_Var19 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            fVar27 = fVar40;
            fVar33 = fVar29;
            fVar36 = fVar30;
            fVar38 = fVar34;
            fVar32 = fVar26;
            fVar28 = fVar31;
          } while (iVar22 != 6);
          paVar13->mTime = (double)(uVar21 & 0xffffffff);
          fVar27 = fVar40 + fVar31 + fVar39;
          if (fVar27 <= 0.0) {
            if ((fVar40 <= fVar31) || (fVar40 <= fVar39)) {
              if (fVar31 <= fVar39) {
                fVar31 = ((fVar39 + 1.0) - fVar40) - fVar31;
                if (fVar31 < 0.0) {
                  fVar31 = sqrtf(fVar31);
                }
                else {
                  fVar31 = SQRT(fVar31);
                }
                fVar31 = fVar31 + fVar31;
                fVar33 = (fVar35 + fVar34) / fVar31;
                fVar36 = (fVar37 + fVar26) / fVar31;
                fVar38 = fVar31 * 0.25;
                fVar27 = (fVar30 - fVar29) / fVar31;
              }
              else {
                fVar39 = ((fVar31 + 1.0) - fVar40) - fVar39;
                if (fVar39 < 0.0) {
                  fVar39 = sqrtf(fVar39);
                }
                else {
                  fVar39 = SQRT(fVar39);
                }
                fVar39 = fVar39 + fVar39;
                fVar33 = (fVar29 + fVar30) / fVar39;
                fVar36 = fVar39 * 0.25;
                fVar38 = (fVar37 + fVar26) / fVar39;
                fVar27 = (fVar35 - fVar34) / fVar39;
              }
            }
            else {
              fVar39 = ((fVar40 + 1.0) - fVar31) - fVar39;
              if (fVar39 < 0.0) {
                fVar39 = sqrtf(fVar39);
              }
              else {
                fVar39 = SQRT(fVar39);
              }
              fVar39 = fVar39 + fVar39;
              fVar33 = fVar39 * 0.25;
              fVar36 = (fVar29 + fVar30) / fVar39;
              fVar38 = (fVar35 + fVar34) / fVar39;
              fVar27 = (fVar26 - fVar37) / fVar39;
            }
          }
          else {
            fVar27 = fVar27 + 1.0;
            if (fVar27 < 0.0) {
              fVar27 = sqrtf(fVar27);
            }
            else {
              fVar27 = SQRT(fVar27);
            }
            fVar27 = fVar27 + fVar27;
            fVar33 = (fVar26 - fVar37) / fVar27;
            fVar36 = (fVar35 - fVar34) / fVar27;
            fVar38 = (fVar30 - fVar29) / fVar27;
            fVar27 = fVar27 * 0.25;
          }
          (paVar13->mValue).w = fVar27;
          (paVar13->mValue).x = fVar33;
          (paVar13->mValue).y = fVar36;
          (paVar13->mValue).z = fVar38;
          paVar13 = paVar13 + 1;
          uVar21 = uVar21 + 1;
        } while (uVar21 < this->mAnimNumFrames);
      }
      paVar9->mNumScalingKeys = 1;
      paVar12 = (aiVectorKey *)operator_new__(0x18);
      paVar12->mTime = 0.0;
      (paVar12->mValue).x = 0.0;
      (paVar12->mValue).y = 0.0;
      (paVar12->mValue).z = 0.0;
      paVar9->mScalingKeys = paVar12;
      paVar12->mTime = 0.0;
      (paVar12->mValue).x = 1.0;
      (paVar12->mValue).y = 1.0;
      (paVar12->mValue).z = 1.0;
      std::
      _Rb_tree<Assimp::BVHLoader::ChannelType,_std::pair<const_Assimp::BVHLoader::ChannelType,_int>,_std::_Select1st<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
      ::~_Rb_tree(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      uVar21 = local_88 + 1;
    } while (uVar21 < local_90->mNumChannels);
  }
  return;
}

Assistant:

void BVHLoader::CreateAnimation( aiScene* pScene)
{
    // create the animation
    pScene->mNumAnimations = 1;
    pScene->mAnimations = new aiAnimation*[1];
    aiAnimation* anim = new aiAnimation;
    pScene->mAnimations[0] = anim;

    // put down the basic parameters
    anim->mName.Set( "Motion");
    anim->mTicksPerSecond = 1.0 / double( mAnimTickDuration);
    anim->mDuration = double( mAnimNumFrames - 1);

    // now generate the tracks for all nodes
    anim->mNumChannels = static_cast<unsigned int>(mNodes.size());
    anim->mChannels = new aiNodeAnim*[anim->mNumChannels];

    // FIX: set the array elements to NULL to ensure proper deletion if an exception is thrown
    for (unsigned int i = 0; i < anim->mNumChannels;++i)
        anim->mChannels[i] = NULL;

    for( unsigned int a = 0; a < anim->mNumChannels; a++)
    {
        const Node& node = mNodes[a];
        const std::string nodeName = std::string( node.mNode->mName.data );
        aiNodeAnim* nodeAnim = new aiNodeAnim;
        anim->mChannels[a] = nodeAnim;
        nodeAnim->mNodeName.Set( nodeName);
		std::map<BVHLoader::ChannelType, int> channelMap;

		//Build map of channels 
		for (unsigned int channel = 0; channel < node.mChannels.size(); ++channel)
		{
			channelMap[node.mChannels[channel]] = channel;
		}

        // translational part, if given
        if( node.mChannels.size() == 6)
        {
            nodeAnim->mNumPositionKeys = mAnimNumFrames;
            nodeAnim->mPositionKeys = new aiVectorKey[mAnimNumFrames];
            aiVectorKey* poskey = nodeAnim->mPositionKeys;
            for( unsigned int fr = 0; fr < mAnimNumFrames; ++fr)
            {
                poskey->mTime = double( fr);

                // Now compute all translations 
                for(BVHLoader::ChannelType channel = Channel_PositionX; channel <= Channel_PositionZ; channel = (BVHLoader::ChannelType)(channel +1))
                {
					//Find channel in node
					std::map<BVHLoader::ChannelType, int>::iterator mapIter = channelMap.find(channel);

					if (mapIter == channelMap.end())
						throw DeadlyImportError("Missing position channel in node " + nodeName);
					else {
						int channelIdx = mapIter->second;
						switch (channel) {
						    case Channel_PositionX: 
                                poskey->mValue.x = node.mChannelValues[fr * node.mChannels.size() + channelIdx]; 
                                break;
						    case Channel_PositionY: 
                                poskey->mValue.y = node.mChannelValues[fr * node.mChannels.size() + channelIdx]; 
                                break;
						    case Channel_PositionZ: 
                                poskey->mValue.z = node.mChannelValues[fr * node.mChannels.size() + channelIdx]; 
                                break;
                                
                            default:
                                break;
						}

					}
                }
                ++poskey;
            }
        } else
        {
            // if no translation part is given, put a default sequence
            aiVector3D nodePos( node.mNode->mTransformation.a4, node.mNode->mTransformation.b4, node.mNode->mTransformation.c4);
            nodeAnim->mNumPositionKeys = 1;
            nodeAnim->mPositionKeys = new aiVectorKey[1];
            nodeAnim->mPositionKeys[0].mTime = 0.0;
            nodeAnim->mPositionKeys[0].mValue = nodePos;
        }

        // rotation part. Always present. First find value offsets
        {

            // Then create the number of rotation keys
            nodeAnim->mNumRotationKeys = mAnimNumFrames;
            nodeAnim->mRotationKeys = new aiQuatKey[mAnimNumFrames];
            aiQuatKey* rotkey = nodeAnim->mRotationKeys;
            for( unsigned int fr = 0; fr < mAnimNumFrames; ++fr)
            {
                aiMatrix4x4 temp;
                aiMatrix3x3 rotMatrix;
				for (BVHLoader::ChannelType channel = Channel_RotationX; channel <= Channel_RotationZ; channel = (BVHLoader::ChannelType)(channel + 1))
				{
					//Find channel in node
					std::map<BVHLoader::ChannelType, int>::iterator mapIter = channelMap.find(channel);

					if (mapIter == channelMap.end())
						throw DeadlyImportError("Missing rotation channel in node " + nodeName);
					else {
						int channelIdx = mapIter->second;
						// translate ZXY euler angels into a quaternion
						const float angle = node.mChannelValues[fr * node.mChannels.size() + channelIdx] * float(AI_MATH_PI) / 180.0f;

						// Compute rotation transformations in the right order
						switch (channel)
						{
							case Channel_RotationX: 
                                aiMatrix4x4::RotationX(angle, temp); rotMatrix *= aiMatrix3x3(temp); 
                                break;
							case Channel_RotationY: 
                                aiMatrix4x4::RotationY(angle, temp); rotMatrix *= aiMatrix3x3(temp);  
                                break;
							case Channel_RotationZ: aiMatrix4x4::RotationZ(angle, temp); rotMatrix *= aiMatrix3x3(temp); 
                                break;
                            default:
                                break;
						}
					}
                }

                rotkey->mTime = double( fr);
                rotkey->mValue = aiQuaternion( rotMatrix);
                ++rotkey;
            }
        }

        // scaling part. Always just a default track
        {
            nodeAnim->mNumScalingKeys = 1;
            nodeAnim->mScalingKeys = new aiVectorKey[1];
            nodeAnim->mScalingKeys[0].mTime = 0.0;
            nodeAnim->mScalingKeys[0].mValue.Set( 1.0f, 1.0f, 1.0f);
        }
    }
}